

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-1.c
# Opt level: O2

int feederBig(void)

{
  DWORD DVar1;
  int iVar2;
  DWORD DVar3;
  uint uVar4;
  FILE *__s;
  int iVar5;
  
  __s = fopen("in.txt","w+");
  if (__s == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
  }
  else {
    printf("Creating large text... ");
    fflush(_stdout);
    DVar1 = GetTickCount();
    fwrite("0123456789abcdef\n",0x11,1,__s);
    iVar5 = 0x800000;
    do {
      iVar5 = iVar5 + -1;
      if (iVar5 == 0) {
        fwrite("0123456789abcdef",0x10,1,__s);
        fclose(__s);
        DVar3 = GetTickCount();
        uVar4 = RoundUptoThousand(DVar3 - DVar1);
        printf("done in T=%u seconds. Starting exe with timeout 2*T... ",(ulong)uVar4 / 1000,
               (ulong)uVar4 % 1000);
        LabTimeout = uVar4 * 2;
        fflush(_stdout);
        return 0;
      }
      iVar2 = fprintf(__s,"0123456789abcde\n");
    } while (iVar2 != -1);
    puts("can\'t create in.txt. No space on disk?");
    fclose(__s);
  }
  return -1;
}

Assistant:

static int feederBig(void)
{
    FILE *const in = fopen("in.txt", "w+");
    int i;
    DWORD t;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    printf("Creating large text... ");
    fflush(stdout);
    t = GetTickCount();
    fprintf(in, "0123456789abcdef\n");
    for (i = 1; i < 1024*1024*8; i++) {
        if (fprintf(in, "0123456789abcde\n") == EOF) {
            printf("can't create in.txt. No space on disk?\n");
            fclose(in);
            return -1;
        }
    }
    fprintf(in, "0123456789abcdef");
    fclose(in);
    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout 2*T... ", (unsigned)t/1000);
    LabTimeout = (int)t*2;
    fflush(stdout);
    return 0;
}